

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall crnlib::mip_level::flip_y(mip_level *this)

{
  bool bVar1;
  mip_level *this_local;
  
  bVar1 = is_valid(this);
  if (bVar1) {
    if (this->m_pDXTImage == (dxt_image *)0x0) {
      if (this->m_pImage == (image_u8 *)0x0) {
        this_local._7_1_ = false;
      }
      else {
        image<crnlib::color_quad<unsigned_char,_int>_>::flip_y(this->m_pImage);
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = dxt_image::flip_y(this->m_pDXTImage);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool mip_level::flip_y() {
  if (!is_valid())
    return false;

  if (m_pDXTImage)
    return m_pDXTImage->flip_y();
  else if (m_pImage) {
    m_pImage->flip_y();
    return true;
  }

  return false;
}